

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O0

int mg_session_read_uint16(mg_session *session,uint16_t *val)

{
  __uint16_t _Var1;
  __uint16_t *in_RSI;
  mg_session *in_RDI;
  int local_4;
  
  if (in_RDI->in_end < in_RDI->in_cursor + 2) {
    mg_session_set_error(in_RDI,"unexpected end of message");
    local_4 = -6;
  }
  else {
    _Var1 = __bswap_16(*(__uint16_t *)(in_RDI->in_buffer + in_RDI->in_cursor));
    *in_RSI = _Var1;
    in_RDI->in_cursor = in_RDI->in_cursor + 2;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mg_session_read_uint16(mg_session *session, uint16_t *val) {
  if (session->in_cursor + 2 > session->in_end) {
    mg_session_set_error(session, "unexpected end of message");
    return MG_ERROR_DECODING_FAILED;
  }
  *val = be16toh(*(uint16_t *)(session->in_buffer + session->in_cursor));
  session->in_cursor += 2;
  return 0;
}